

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QString * __thiscall
QMdiSubWindowPrivate::originalWindowTitleHelper
          (QString *__return_storage_ptr__,QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  QMdiArea *this_01;
  QWidgetPrivate *pQVar2;
  QWidget *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QMdiSubWindow_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_01 = QMdiSubWindow::mdiArea((QMdiSubWindow *)pQVar3);
  if (this_01 != (QMdiArea *)0x0) {
    QMdiArea::subWindowList((QList<QMdiSubWindow_*> *)&local_50,this_01,CreationOrder);
    for (lVar4 = 0; local_50.size << 3 != lVar4; lVar4 = lVar4 + 8) {
      this_00 = *(QWidget **)((long)local_50.ptr + lVar4);
      if (this_00 != pQVar3) {
        bVar1 = QWidget::isMaximized(this_00);
        if (bVar1) {
          pQVar2 = qt_widget_private(this_00);
          if (*(long *)&pQVar2[1].size_policy != 0) {
            QArrayDataPointer<char16_t>::QArrayDataPointer
                      (&__return_storage_ptr__->d,
                       (QArrayDataPointer<char16_t> *)&pQVar2[1].data.wrect.x2);
            QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_50);
            goto LAB_004149bd;
          }
        }
      }
    }
    QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_50);
  }
  pQVar3 = QWidget::window(pQVar3);
  QWidget::windowTitle(__return_storage_ptr__,pQVar3);
LAB_004149bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMdiSubWindowPrivate::originalWindowTitleHelper() const
{
    Q_Q(const QMdiSubWindow);
    // QTBUG-92240: When DontMaximizeSubWindowOnActivation is set and
    // there is another subwindow maximized, use its original title.
    if (auto *mdiArea = q->mdiArea()) {
        const auto &subWindows = mdiArea->subWindowList();
        for (auto *subWindow : subWindows) {
            if (subWindow != q && subWindow->isMaximized()) {
                auto *subWindowD = static_cast<QMdiSubWindowPrivate *>(qt_widget_private(subWindow));
                if (!subWindowD->originalTitle.isNull())
                    return subWindowD->originalTitle;
            }
        }
    }
    return q->window()->windowTitle();
}